

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleCongruenceClosure.cpp
# Opt level: O3

void __thiscall
DP::SimpleCongruenceClosure::getUnsatCore
          (SimpleCongruenceClosure *this,LiteralStack *res,uint coreIndex)

{
  CEq *pCVar1;
  CEq *pCVar2;
  Literal *pLVar3;
  pair<unsigned_int,_unsigned_int> pVar4;
  ConstInfo *pCVar5;
  ConstInfo *pCVar6;
  CPair CVar7;
  CPair CVar8;
  pair<unsigned_int,_unsigned_int> *ppVar9;
  int iVar10;
  int iVar11;
  Literal **ppLVar12;
  pair<unsigned_int,_unsigned_int> **pppVar13;
  uint uVar14;
  uint uVar15;
  IntUnionFind explained;
  IntUnionFind local_68;
  
  pCVar2 = (this->_unsatEqs)._stack;
  pCVar1 = pCVar2 + coreIndex;
  uVar14 = pCVar1->c1;
  uVar15 = pCVar1->c2;
  pLVar3 = pCVar2[coreIndex].foPremise;
  if (pLVar3 != (Literal *)0x0) {
    ppLVar12 = res->_cursor;
    if (ppLVar12 == res->_end) {
      Lib::Stack<Kernel::Literal_*>::expand(res);
      ppLVar12 = res->_cursor;
    }
    *ppLVar12 = pLVar3;
    res->_cursor = res->_cursor + 1;
  }
  if (getUnsatCore(Lib::Stack<Kernel::Literal*>&,unsigned_int)::toExplain == '\0') {
    getUnsatCore();
  }
  if (getUnsatCore::toExplain._cursor == getUnsatCore::toExplain._end) {
    Lib::Stack<std::pair<unsigned_int,_unsigned_int>_>::expand(&getUnsatCore::toExplain);
  }
  ppVar9 = getUnsatCore::toExplain._cursor;
  ppVar9->first = uVar14;
  ppVar9->second = uVar15;
  getUnsatCore::toExplain._cursor = getUnsatCore::toExplain._cursor + 1;
  Lib::IntUnionFind::IntUnionFind(&local_68,(int)(this->_cInfos)._size);
  if (getUnsatCore(Lib::Stack<Kernel::Literal*>&,unsigned_int)::pathStack == '\0') {
    getUnsatCore();
  }
  if (getUnsatCore::toExplain._cursor != getUnsatCore::toExplain._stack) {
    do {
      pVar4 = getUnsatCore::toExplain._cursor[-1];
      uVar15 = pVar4.first;
      getUnsatCore::toExplain._cursor = getUnsatCore::toExplain._cursor + -1;
      iVar10 = Lib::IntUnionFind::root(&local_68,uVar15);
      uVar14 = pVar4.second;
      iVar11 = Lib::IntUnionFind::root(&local_68,uVar14);
      if (iVar10 != iVar11) {
        getUnsatCore::pathStack._cursor = getUnsatCore::pathStack._stack;
        collectUnifyingPath(this,uVar15,uVar14,&getUnsatCore::pathStack);
        while (getUnsatCore::pathStack._cursor != getUnsatCore::pathStack._stack) {
          uVar14 = getUnsatCore::pathStack._cursor[-1];
          pCVar5 = (this->_cInfos)._array;
          getUnsatCore::pathStack._cursor = getUnsatCore::pathStack._cursor + -1;
          iVar10 = Lib::IntUnionFind::root(&local_68,pCVar5[uVar14].predecessorPremise.c1);
          iVar11 = Lib::IntUnionFind::root(&local_68,pCVar5[uVar14].predecessorPremise.c2);
          if (iVar10 != iVar11) {
            if (pCVar5[uVar14].predecessorPremise.foOrigin == true) {
              pLVar3 = pCVar5[uVar14].predecessorPremise.foPremise;
              if (pLVar3 != (Literal *)0x0) {
                ppLVar12 = res->_cursor;
                if (ppLVar12 == res->_end) {
                  Lib::Stack<Kernel::Literal_*>::expand(res);
                  ppLVar12 = res->_cursor;
                }
                *ppLVar12 = pLVar3;
                pppVar13 = (pair<unsigned_int,_unsigned_int> **)&res->_cursor;
                goto LAB_0027f22f;
              }
            }
            else {
              pCVar6 = (this->_cInfos)._array;
              CVar7 = pCVar6[pCVar5[uVar14].predecessorPremise.c1].namedPair;
              CVar8 = pCVar6[pCVar5[uVar14].predecessorPremise.c2].namedPair;
              if (getUnsatCore::toExplain._cursor == getUnsatCore::toExplain._end) {
                Lib::Stack<std::pair<unsigned_int,_unsigned_int>_>::expand(&getUnsatCore::toExplain)
                ;
              }
              *getUnsatCore::toExplain._cursor =
                   (pair<unsigned_int,_unsigned_int>)
                   ((ulong)CVar7 & 0xffffffff | (long)CVar8 << 0x20);
              getUnsatCore::toExplain._cursor = getUnsatCore::toExplain._cursor + 1;
              if (getUnsatCore::toExplain._cursor == getUnsatCore::toExplain._end) {
                Lib::Stack<std::pair<unsigned_int,_unsigned_int>_>::expand(&getUnsatCore::toExplain)
                ;
              }
              *getUnsatCore::toExplain._cursor =
                   (pair<unsigned_int,_unsigned_int>)
                   ((ulong)CVar8 & 0xffffffff00000000 | (ulong)CVar7 >> 0x20);
              pppVar13 = &getUnsatCore::toExplain._cursor;
LAB_0027f22f:
              *pppVar13 = *pppVar13 + 1;
            }
            Lib::IntUnionFind::doUnion
                      (&local_68,pCVar5[uVar14].predecessorPremise.c1,
                       pCVar5[uVar14].predecessorPremise.c2);
          }
        }
      }
    } while (getUnsatCore::toExplain._cursor != getUnsatCore::toExplain._stack);
  }
  Lib::IntUnionFind::~IntUnionFind(&local_68);
  return;
}

Assistant:

void SimpleCongruenceClosure::getUnsatCore(LiteralStack& res, unsigned coreIndex)
{
  ASS(res.isEmpty());
  ASS_L(coreIndex,_unsatEqs.size());

  CEq unsatEq = _unsatEqs[coreIndex];

  ASS(unsatEq.foOrigin);
  if(unsatEq.foPremise) {
    res.push(unsatEq.foPremise);
  }

  static Stack<CPair> toExplain;
  toExplain.push(CPair(unsatEq.c1, unsatEq.c2));
  ASS_EQ(deref(toExplain.top().first), deref(toExplain.top().second));

  IntUnionFind explained(getMaxConst()+1);
  static Stack<unsigned> pathStack;

  while(toExplain.isNonEmpty()) {
    CPair curr = toExplain.pop();
    ASS_EQ(deref(curr.first), deref(curr.second));

    if(explained.root(curr.first)==explained.root(curr.second)) {
      //we've already explained this equality
      continue;
    }
    pathStack.reset();
    // put into pathStack constants whose premises imply the equality
    collectUnifyingPath(curr.first, curr.second, pathStack);
    while(pathStack.isNonEmpty()) {
      unsigned proofStepConst = pathStack.pop();
      CEq& prem = _cInfos[proofStepConst].predecessorPremise;
      if(explained.root(prem.c1)==explained.root(prem.c2)) {
        //we've already explained this equality
        continue;
      }
      if(prem.foOrigin) {
	if(prem.foPremise) {
	  res.push(prem.foPremise);
	} // Martin: this should be only null for the "built-in" dis-equality (_posLitConst != _negLitConst)
      }
      else {
	//the equality was implied by congruence between the following two pairs:
	CPair cp1 = _cInfos[prem.c1].namedPair;
	CPair cp2 = _cInfos[prem.c2].namedPair;
	ASS_NEQ(cp1.first,0);
	ASS_NEQ(cp1.second,0);
	ASS_NEQ(cp2.first,0);
	ASS_NEQ(cp2.second,0);
	toExplain.push(CPair(cp1.first, cp2.first));
	ASS_EQ(deref(toExplain.top().first), deref(toExplain.top().second));
	toExplain.push(CPair(cp1.second, cp2.second));
	ASS_EQ(deref(toExplain.top().first), deref(toExplain.top().second));
      }
      explained.doUnion(prem.c1, prem.c2);
    }
  }
}